

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake_query.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmakels::cmake_query::cmake_query::get_target_names
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmake_query *this,string *uri)

{
  cmMakefile *pcVar1;
  string *__x;
  __node_base *p_Var2;
  
  pcVar1 = get_makefile(this,uri);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pcVar1 != (cmMakefile *)0x0) {
    p_Var2 = &(pcVar1->Targets)._M_h._M_before_begin;
    while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
      __x = cmTarget::GetName_abi_cxx11_((cmTarget *)(p_Var2 + 5));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,__x);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmake_query::get_target_names(std::string const &uri) {
  auto mf = get_makefile(uri);
  std::vector<std::string> result;
  if (mf) {
    auto &target_map = mf->GetTargets();
    for (auto const &[name, target] : target_map) {
      result.push_back(target.GetName());
    }
  }
  return result;
}